

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O0

void __thiscall
Assimp::StreamWriter<false,_false>::Put<long>(StreamWriter<false,_false> *this,long f)

{
  size_t sVar1;
  size_type sVar2;
  long *plVar3;
  void *dest;
  long local_18;
  long f_local;
  StreamWriter<false,_false> *this_local;
  
  local_18 = f;
  f_local = (long)this;
  Intern::Getter<false,_long,_false>::operator()
            ((Getter<false,_long,_false> *)((long)&dest + 7),&local_18,(bool)(this->le & 1));
  sVar1 = this->cursor;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer);
  if (sVar2 <= sVar1 + 8) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->buffer,this->cursor + 8);
  }
  plVar3 = (long *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->buffer,this->cursor);
  *plVar3 = local_18;
  this->cursor = this->cursor + 8;
  return;
}

Assistant:

void Put(T f)   {
        Intern :: Getter<SwapEndianess,T,RuntimeSwitch>() (&f, le);

        if (cursor + sizeof(T) >= buffer.size()) {
            buffer.resize(cursor + sizeof(T));
        }

        void* dest = &buffer[cursor];

        // reinterpret_cast + assignment breaks strict aliasing rules
        // and generally causes trouble on platforms such as ARM that
        // do not silently ignore alignment faults.
        ::memcpy(dest, &f, sizeof(T));
        cursor += sizeof(T);
    }